

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall icu_63::CopyHelper::copyCE32(CopyHelper *this,uint32_t ce32)

{
  CollationDataBuilder *pCVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar6;
  undefined4 extraout_var_01;
  UnicodeString *pUVar7;
  UnicodeString local_e0;
  int local_9c;
  ConditionalCE32 *pCStack_98;
  int32_t suffixStart;
  ConditionalCE32 *prevDestCond;
  ConditionalCE32 *pCStack_88;
  int32_t destIndex;
  ConditionalCE32 *cond;
  long lStack_78;
  int32_t j_1;
  int64_t ce_2;
  int64_t srcCE;
  char local_5d;
  int32_t i_1;
  UBool isModified_1;
  int64_t *piStack_58;
  int32_t length_1;
  int64_t *srcCEs;
  long lStack_48;
  int32_t j;
  int64_t ce_1;
  char local_35;
  int32_t i;
  UBool isModified;
  int32_t *piStack_30;
  int32_t length;
  uint32_t *srcCE32s;
  long lStack_20;
  int32_t tag;
  int64_t ce;
  CopyHelper *pCStack_10;
  uint32_t ce32_local;
  CopyHelper *this_local;
  
  ce._4_4_ = ce32;
  pCStack_10 = this;
  UVar2 = Collation::isSpecialCE32(ce32);
  if (UVar2 == '\0') {
    iVar3 = (*(this->modifier->super_UObject)._vptr_UObject[3])(this->modifier,(ulong)ce._4_4_);
    lStack_20 = CONCAT44(extraout_var,iVar3);
    if (lStack_20 != 0x101000100) {
      ce._4_4_ = CollationDataBuilder::encodeOneCE(this->dest,lStack_20,&this->errorCode);
    }
  }
  else {
    srcCE32s._4_4_ = Collation::tagFromCE32(ce._4_4_);
    if (srcCE32s._4_4_ == 5) {
      piStack_30 = UVector32::getBuffer(&this->src->ce32s);
      iVar4 = Collation::indexFromCE32(ce._4_4_);
      piStack_30 = piStack_30 + iVar4;
      i = Collation::lengthFromCE32(ce._4_4_);
      local_35 = '\0';
      for (ce_1._4_4_ = 0; ce_1._4_4_ < i; ce_1._4_4_ = ce_1._4_4_ + 1) {
        ce._4_4_ = piStack_30[ce_1._4_4_];
        UVar2 = Collation::isSpecialCE32(ce._4_4_);
        if (UVar2 == '\0') {
          iVar3 = (*(this->modifier->super_UObject)._vptr_UObject[3])
                            (this->modifier,(ulong)ce._4_4_);
          lStack_48 = CONCAT44(extraout_var_00,iVar3);
          if (lStack_48 == 0x101000100) goto LAB_0028beff;
          if (local_35 == '\0') {
            for (srcCEs._4_4_ = 0; srcCEs._4_4_ < ce_1._4_4_; srcCEs._4_4_ = srcCEs._4_4_ + 1) {
              iVar6 = Collation::ceFromCE32(piStack_30[srcCEs._4_4_]);
              this->modifiedCEs[srcCEs._4_4_] = iVar6;
            }
            local_35 = '\x01';
          }
          this->modifiedCEs[ce_1._4_4_] = lStack_48;
        }
        else {
LAB_0028beff:
          if (local_35 != '\0') {
            iVar6 = Collation::ceFromCE32(ce._4_4_);
            this->modifiedCEs[ce_1._4_4_] = iVar6;
          }
        }
      }
      if (local_35 == '\0') {
        ce._4_4_ = CollationDataBuilder::encodeExpansion32(this->dest,piStack_30,i,&this->errorCode)
        ;
      }
      else {
        ce._4_4_ = (*(this->dest->super_UObject)._vptr_UObject[4])
                             (this->dest,this->modifiedCEs,(ulong)(uint)i,&this->errorCode);
      }
    }
    else if (srcCE32s._4_4_ == 6) {
      piStack_58 = UVector64::getBuffer(&this->src->ce64s);
      iVar4 = Collation::indexFromCE32(ce._4_4_);
      piStack_58 = piStack_58 + iVar4;
      i_1 = Collation::lengthFromCE32(ce._4_4_);
      local_5d = '\0';
      for (srcCE._4_4_ = 0; srcCE._4_4_ < i_1; srcCE._4_4_ = srcCE._4_4_ + 1) {
        ce_2 = piStack_58[srcCE._4_4_];
        iVar3 = (*(this->modifier->super_UObject)._vptr_UObject[4])(this->modifier,ce_2);
        lStack_78 = CONCAT44(extraout_var_01,iVar3);
        if (lStack_78 == 0x101000100) {
          if (local_5d != '\0') {
            this->modifiedCEs[srcCE._4_4_] = ce_2;
          }
        }
        else {
          if (local_5d == '\0') {
            for (cond._4_4_ = 0; cond._4_4_ < srcCE._4_4_; cond._4_4_ = cond._4_4_ + 1) {
              this->modifiedCEs[cond._4_4_] = piStack_58[cond._4_4_];
            }
            local_5d = '\x01';
          }
          this->modifiedCEs[srcCE._4_4_] = lStack_78;
        }
      }
      if (local_5d == '\0') {
        ce._4_4_ = CollationDataBuilder::encodeExpansion(this->dest,piStack_58,i_1,&this->errorCode)
        ;
      }
      else {
        ce._4_4_ = (*(this->dest->super_UObject)._vptr_UObject[4])
                             (this->dest,this->modifiedCEs,(ulong)(uint)i_1,&this->errorCode);
      }
    }
    else if (srcCE32s._4_4_ == 7) {
      pCStack_88 = CollationDataBuilder::getConditionalCE32ForCE32(this->src,ce._4_4_);
      pCVar1 = this->dest;
      pUVar7 = &pCStack_88->context;
      uVar5 = copyCE32(this,pCStack_88->ce32);
      prevDestCond._4_4_ =
           CollationDataBuilder::addConditionalCE32(pCVar1,pUVar7,uVar5,&this->errorCode);
      ce._4_4_ = CollationDataBuilder::makeBuilderContextCE32(prevDestCond._4_4_);
      while (-1 < pCStack_88->next) {
        pCStack_88 = CollationDataBuilder::getConditionalCE32(this->src,pCStack_88->next);
        pCStack_98 = CollationDataBuilder::getConditionalCE32(this->dest,prevDestCond._4_4_);
        pCVar1 = this->dest;
        pUVar7 = &pCStack_88->context;
        uVar5 = copyCE32(this,pCStack_88->ce32);
        prevDestCond._4_4_ =
             CollationDataBuilder::addConditionalCE32(pCVar1,pUVar7,uVar5,&this->errorCode);
        iVar4 = ConditionalCE32::prefixLength(pCStack_88);
        local_9c = iVar4 + 1;
        pCVar1 = this->dest;
        UnicodeString::tempSubString(&local_e0,&pCStack_88->context,local_9c,0x7fffffff);
        UnicodeSet::addAll(&pCVar1->unsafeBackwardSet,&local_e0);
        UnicodeString::~UnicodeString(&local_e0);
        pCStack_98->next = prevDestCond._4_4_;
      }
    }
  }
  return ce._4_4_;
}

Assistant:

uint32_t copyCE32(uint32_t ce32) {
        if(!Collation::isSpecialCE32(ce32)) {
            int64_t ce = modifier.modifyCE32(ce32);
            if(ce != Collation::NO_CE) {
                ce32 = dest.encodeOneCE(ce, errorCode);
            }
        } else {
            int32_t tag = Collation::tagFromCE32(ce32);
            if(tag == Collation::EXPANSION32_TAG) {
                const uint32_t *srcCE32s = reinterpret_cast<uint32_t *>(src.ce32s.getBuffer());
                srcCE32s += Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                // Inspect the source CE32s. Just copy them if none are modified.
                // Otherwise copy to modifiedCEs, with modifications.
                UBool isModified = FALSE;
                for(int32_t i = 0; i < length; ++i) {
                    ce32 = srcCE32s[i];
                    int64_t ce;
                    if(Collation::isSpecialCE32(ce32) ||
                            (ce = modifier.modifyCE32(ce32)) == Collation::NO_CE) {
                        if(isModified) {
                            modifiedCEs[i] = Collation::ceFromCE32(ce32);
                        }
                    } else {
                        if(!isModified) {
                            for(int32_t j = 0; j < i; ++j) {
                                modifiedCEs[j] = Collation::ceFromCE32(srcCE32s[j]);
                            }
                            isModified = TRUE;
                        }
                        modifiedCEs[i] = ce;
                    }
                }
                if(isModified) {
                    ce32 = dest.encodeCEs(modifiedCEs, length, errorCode);
                } else {
                    ce32 = dest.encodeExpansion32(
                        reinterpret_cast<const int32_t *>(srcCE32s), length, errorCode);
                }
            } else if(tag == Collation::EXPANSION_TAG) {
                const int64_t *srcCEs = src.ce64s.getBuffer();
                srcCEs += Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                // Inspect the source CEs. Just copy them if none are modified.
                // Otherwise copy to modifiedCEs, with modifications.
                UBool isModified = FALSE;
                for(int32_t i = 0; i < length; ++i) {
                    int64_t srcCE = srcCEs[i];
                    int64_t ce = modifier.modifyCE(srcCE);
                    if(ce == Collation::NO_CE) {
                        if(isModified) {
                            modifiedCEs[i] = srcCE;
                        }
                    } else {
                        if(!isModified) {
                            for(int32_t j = 0; j < i; ++j) {
                                modifiedCEs[j] = srcCEs[j];
                            }
                            isModified = TRUE;
                        }
                        modifiedCEs[i] = ce;
                    }
                }
                if(isModified) {
                    ce32 = dest.encodeCEs(modifiedCEs, length, errorCode);
                } else {
                    ce32 = dest.encodeExpansion(srcCEs, length, errorCode);
                }
            } else if(tag == Collation::BUILDER_DATA_TAG) {
                // Copy the list of ConditionalCE32.
                ConditionalCE32 *cond = src.getConditionalCE32ForCE32(ce32);
                U_ASSERT(!cond->hasContext());
                int32_t destIndex = dest.addConditionalCE32(
                        cond->context, copyCE32(cond->ce32), errorCode);
                ce32 = CollationDataBuilder::makeBuilderContextCE32(destIndex);
                while(cond->next >= 0) {
                    cond = src.getConditionalCE32(cond->next);
                    ConditionalCE32 *prevDestCond = dest.getConditionalCE32(destIndex);
                    destIndex = dest.addConditionalCE32(
                            cond->context, copyCE32(cond->ce32), errorCode);
                    int32_t suffixStart = cond->prefixLength() + 1;
                    dest.unsafeBackwardSet.addAll(cond->context.tempSubString(suffixStart));
                    prevDestCond->next = destIndex;
                }
            } else {
                // Just copy long CEs and Latin mini expansions (and other expected values) as is,
                // assuming that the modifier would not modify them.
                U_ASSERT(tag == Collation::LONG_PRIMARY_TAG ||
                        tag == Collation::LONG_SECONDARY_TAG ||
                        tag == Collation::LATIN_EXPANSION_TAG ||
                        tag == Collation::HANGUL_TAG);
            }
        }
        return ce32;
    }